

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::DeformableConv2D_x86_avx512::create_pipeline(DeformableConv2D_x86_avx512 *this,Option *opt)

{
  uint uVar1;
  _func_int *p_Var2;
  void *__ptr;
  Allocator *pAVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Mat *pMVar8;
  int _h;
  _func_int **pp_Var9;
  Layer *pLVar10;
  int *piVar11;
  int ic;
  uint _h_00;
  undefined4 *puVar12;
  ulong uVar13;
  int i;
  long lVar14;
  ulong uVar15;
  int j;
  ulong uVar16;
  _func_int ***ppp_Var17;
  long lVar18;
  _func_int **pp_Var19;
  ulong uVar20;
  ulong uVar21;
  _func_int **pp_Var22;
  uint uVar23;
  uint uVar24;
  undefined4 *puVar25;
  undefined4 *puVar26;
  ParamDict pd_5;
  ParamDict pd;
  undefined1 local_178 [8];
  int local_170;
  Allocator *local_168;
  int iStack_160;
  int iStack_15c;
  size_t sStack_158;
  int local_150 [2];
  size_t local_148 [2];
  undefined4 uStack_138;
  undefined4 uStack_134;
  size_t local_130;
  undefined4 local_128;
  undefined8 local_120;
  undefined4 uStack_118;
  undefined4 uStack_114;
  size_t sStack_110;
  undefined4 local_108;
  undefined8 local_100;
  undefined4 *local_f0;
  undefined4 *local_e8;
  ModelBinFromMatArray local_e0;
  uint local_cc;
  Mat local_c8;
  ulong local_80;
  ulong local_78;
  Mat *local_70;
  ulong local_68;
  long local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  undefined4 *local_40;
  void *local_38;
  
  pp_Var9 = this->_vptr_DeformableConv2D_x86_avx512;
  p_Var2 = pp_Var9[-3];
  switch(*(undefined4 *)(&this->field_0x104 + (long)p_Var2)) {
  case 1:
    pLVar10 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar10->_vptr_Layer[2])(pLVar10,&pd);
    break;
  case 2:
    pLVar10 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)(&this->field_0x108 + (long)p_Var2));
    (*pLVar10->_vptr_Layer[2])(pLVar10,&pd);
    break;
  case 3:
    pLVar10 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)(&this->field_0x108 + (long)p_Var2));
    ParamDict::set(&pd,1,*(float *)(*(long *)(&this->field_0x108 + (long)p_Var2) + 4));
    (*pLVar10->_vptr_Layer[2])(pLVar10,&pd);
    break;
  case 4:
    pLVar10 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar10->_vptr_Layer[2])(pLVar10,&pd);
    break;
  case 5:
    pLVar10 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar10->_vptr_Layer[2])(pLVar10,&pd);
    break;
  case 6:
    pLVar10 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)(&this->field_0x108 + (long)p_Var2));
    ParamDict::set(&pd,1,*(float *)(*(long *)(&this->field_0x108 + (long)p_Var2) + 4));
    (*pLVar10->_vptr_Layer[2])(pLVar10,&pd);
    break;
  default:
    pLVar10 = (Layer *)0x0;
    goto LAB_004c439a;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar10->_vptr_Layer[4])(pLVar10,opt);
  pp_Var9 = this->_vptr_DeformableConv2D_x86_avx512;
LAB_004c439a:
  this->activation = pLVar10;
  p_Var2 = pp_Var9[-3];
  local_78 = (ulong)*(int *)(&this->field_0xd4 + (long)p_Var2);
  local_80 = (ulong)*(int *)(&this->field_0xd8 + (long)p_Var2);
  _h_00 = *(int *)(&this->field_0xd8 + (long)p_Var2) * *(int *)(&this->field_0xd4 + (long)p_Var2);
  uVar21 = (ulong)_h_00;
  uVar1 = *(uint *)(&this->field_0xd0 + (long)p_Var2);
  uVar20 = (long)*(int *)(&this->field_0x100 + (long)p_Var2) / (long)(int)_h_00;
  uVar20 = (ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | uVar20 & 0xffffffff;
  uVar15 = (long)uVar20 / (long)(int)uVar1;
  _h = (int)uVar15;
  if (opt->use_packing_layout == true) {
    uVar24 = 0x10;
    if ((uVar15 & 0xf) != 0) {
      if ((uVar15 & 7) == 0) {
        uVar24 = 8;
      }
      else {
        uVar24 = (uint)((uVar15 & 3) == 0) * 3 + 1;
      }
    }
    uVar23 = 0x10;
    if ((uVar1 & 0xf) != 0) {
      if ((uVar1 & 7) == 0) {
        uVar23 = 8;
      }
      else {
        uVar23 = (uint)((uVar1 & 3) == 0) * 3 + 1;
      }
    }
  }
  else {
    uVar24 = 1;
    uVar23 = uVar24;
  }
  uVar16 = (ulong)uVar24;
  if (opt->use_sgemm_convolution == true) {
    pLVar10 = create_layer(0x4a);
    this->gemm = pLVar10;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,2,0);
    ParamDict::set(&pd_5,3,0);
    ParamDict::set(&pd_5,4,1);
    ParamDict::set(&pd_5,5,0);
    ParamDict::set(&pd_5,6,1);
    ParamDict::set(&pd_5,7,*(int *)(&this->field_0xd0 +
                                   (long)this->_vptr_DeformableConv2D_x86_avx512[-3]));
    ParamDict::set(&pd_5,8,0);
    ParamDict::set(&pd_5,9,_h * _h_00);
    ParamDict::set(&pd_5,10,-(uint)(*(int *)(&this->field_0xfc +
                                            (long)this->_vptr_DeformableConv2D_x86_avx512[-3]) == 0)
                            | 1);
    ParamDict::set(&pd_5,0xb,1);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&pd_5);
    local_c8.cstep = 0;
    local_c8.data = (Allocator *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
    local_c8.elempack = 0;
    local_c8.allocator = (Allocator *)local_c8.data;
    local_c8.dims = (int)local_c8.refcount;
    local_c8.w = local_c8.refcount._4_4_;
    local_c8._48_8_ = local_c8.elemsize;
    local_c8.c = local_c8.elempack;
    Mat::reshape((Mat *)&pd,
                 (Mat *)(&this->field_0x150 + (long)this->_vptr_DeformableConv2D_x86_avx512[-3]),
                 _h_00,_h,(int)((Mat *)(&this->field_0x150 +
                                       (long)this->_vptr_DeformableConv2D_x86_avx512[-3]))[-2].
                               elemsize,(Allocator *)0x0);
    lVar14 = 0;
    Mat::create(&local_c8,_h * _h_00,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_avx512[-3]),4,
                (Allocator *)0x0);
    pp_Var9 = this->_vptr_DeformableConv2D_x86_avx512;
    if ((int)_h_00 < 1) {
      uVar21 = 0;
    }
    for (; lVar14 < *(int *)(&this->field_0xd0 + (long)pp_Var9[-3]); lVar14 = lVar14 + 1) {
      ppp_Var17 = (_func_int ***)
                  ((long)(_func_int ***)local_c8.data +
                  (long)local_c8.w * local_c8.elemsize * lVar14);
      for (lVar18 = 0; lVar18 < (long)((long)_h - (ulong)(uVar24 - 1)); lVar18 = lVar18 + uVar16) {
        pp_Var19 = (_func_int **)
                   ((iStack_15c * lVar18 + local_148[0] * lVar14) * (long)local_178 +
                   (long)pd._vptr_ParamDict);
        for (uVar20 = 0; pp_Var22 = pp_Var19, uVar15 = uVar16, uVar20 != uVar21; uVar20 = uVar20 + 1
            ) {
          while (uVar15 != 0) {
            *(undefined4 *)ppp_Var17 = *(undefined4 *)pp_Var22;
            ppp_Var17 = (_func_int ***)((long)ppp_Var17 + 4);
            pp_Var22 = (_func_int **)((long)pp_Var22 + (long)local_178 * (long)iStack_15c);
            uVar15 = uVar15 - 1;
          }
          pp_Var19 = (_func_int **)((long)pp_Var19 + 4);
        }
      }
    }
    piVar11 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_168 == (Allocator *)0x0) {
          free(pd._vptr_ParamDict);
        }
        else {
          (*local_168->_vptr_Allocator[3])();
        }
      }
    }
    if (*(int *)(&this->field_0xfc + (long)this->_vptr_DeformableConv2D_x86_avx512[-3]) == 0) {
      piVar11 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      pd._vptr_ParamDict = (_func_int **)local_c8.data;
      pd.d._0_4_ = (int)local_c8.refcount;
      pd.d._4_4_ = local_c8.refcount._4_4_;
      local_178 = (undefined1  [8])local_c8.elemsize;
      local_170 = local_c8.elempack;
      local_168 = local_c8.allocator;
      iStack_160 = local_c8.dims;
      iStack_15c = local_c8.w;
      sStack_158._0_4_ = local_c8.h;
      sStack_158._4_4_ = local_c8.d;
      local_150[0] = local_c8.c;
      local_148[0] = local_c8.cstep;
      pLVar10 = this->gemm;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_e0,(Mat *)&pd);
      (*pLVar10->_vptr_Layer[3])(pLVar10,&local_e0);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_e0);
      piVar11 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_168 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_168->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      local_178 = SUB128(ZEXT812(0),4);
      piVar11 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      local_100 = 0;
      local_108 = 0;
      sStack_110 = (size_t)local_178;
      uStack_114 = 0;
      uStack_118 = 0;
      local_120 = 0;
      local_128 = 0;
      local_130 = (size_t)local_178;
      uStack_134 = 0;
      uStack_138 = 0;
      local_148[1] = 0;
      p_Var2 = this->_vptr_DeformableConv2D_x86_avx512[-3];
      if (local_148 + 1 != (size_t *)(&this->field_0x198 + (long)p_Var2)) {
        piVar11 = *(int **)(&this->field_0x1a0 + (long)p_Var2);
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + 1;
          UNLOCK();
        }
        local_148[1] = *(size_t *)(&this->field_0x198 + (long)p_Var2);
        uStack_138 = (undefined4)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var2);
        uStack_134 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var2) >> 0x20)
        ;
        local_130 = *(size_t *)(&this->field_0x1a8 + (long)p_Var2);
        local_128 = *(undefined4 *)(&this->field_0x1b0 + (long)p_Var2);
        local_120 = *(undefined8 *)(&this->field_0x1b8 + (long)p_Var2);
        sStack_110 = *(size_t *)(&this->field_0x1c8 + (long)p_Var2);
        uStack_118 = (undefined4)*(undefined8 *)(&this->field_0x1c0 + (long)p_Var2);
        uStack_114 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1c0 + (long)p_Var2) >> 0x20)
        ;
        local_108 = *(undefined4 *)(&this->field_0x1d0 + (long)p_Var2);
        local_100 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var2);
      }
      local_148[0] = local_c8.cstep;
      local_150[0] = local_c8.c;
      sStack_158._0_4_ = local_c8.h;
      sStack_158._4_4_ = local_c8.d;
      iStack_15c = local_c8.w;
      iStack_160 = local_c8.dims;
      local_168 = local_c8.allocator;
      local_170 = local_c8.elempack;
      local_178 = (undefined1  [8])local_c8.elemsize;
      pd.d._4_4_ = local_c8.refcount._4_4_;
      pd.d._0_4_ = (int)local_c8.refcount;
      pd._vptr_ParamDict = (_func_int **)local_c8.data;
      pLVar10 = this->gemm;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_e0,(Mat *)&pd);
      (*pLVar10->_vptr_Layer[3])(pLVar10,&local_e0);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_e0);
      lVar14 = 0x48;
      do {
        piVar11 = *(int **)((long)&pd.d + lVar14);
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if (*(long **)((long)&local_168 + lVar14) == (long *)0x0) {
              free(*(void **)((long)&pd._vptr_ParamDict + lVar14));
            }
            else {
              (**(code **)(**(long **)((long)&local_168 + lVar14) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)local_148 + lVar14) = 0;
        *(undefined8 *)((long)&pd.d + lVar14 + 4) = 0;
        *(undefined8 *)(local_178 + lVar14 + 4) = 0;
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar14) = 0;
        *(undefined8 *)((long)&pd.d + lVar14) = 0;
        *(undefined4 *)((long)local_150 + lVar14) = 0;
        *(undefined8 *)((long)&iStack_160 + lVar14) = 0;
        *(undefined8 *)((long)local_150 + lVar14 + -8) = 0;
        lVar14 = lVar14 + -0x48;
      } while (lVar14 != -0x48);
    }
    (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
    piVar11 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          free(local_c8.data);
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    ParamDict::~ParamDict(&pd_5);
  }
  else if ((uVar23 == 1) && (uVar24 == 1)) {
    if (p_Var2 != (_func_int *)0xfffffffffffffec0) {
      piVar11 = *(int **)(&this->field_0x158 + (long)p_Var2);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      piVar11 = (this->weight_data_tm).refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          __ptr = (this->weight_data_tm).data;
          pAVar3 = (this->weight_data_tm).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            free(__ptr);
          }
          else {
            (*pAVar3->_vptr_Allocator[3])(pAVar3,__ptr,(long)uVar20 % (long)(int)uVar1 & 0xffffffff)
            ;
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      (this->weight_data_tm).data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      (this->weight_data_tm).c = 0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      piVar11 = *(int **)((long)(&this->field_0x150 + (long)p_Var2) + 8);
      (this->weight_data_tm).data = *(void **)(&this->field_0x150 + (long)p_Var2);
      (this->weight_data_tm).refcount = piVar11;
      (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x160 + (long)p_Var2);
      (this->weight_data_tm).elempack = *(int *)(&this->field_0x168 + (long)p_Var2);
      (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x170 + (long)p_Var2);
      uVar6 = *(undefined8 *)(&this->field_0x178 + (long)p_Var2);
      uVar7 = *(undefined8 *)((long)(&this->field_0x178 + (long)p_Var2) + 8);
      (this->weight_data_tm).dims = (int)uVar6;
      (this->weight_data_tm).w = (int)((ulong)uVar6 >> 0x20);
      (this->weight_data_tm).h = (int)uVar7;
      (this->weight_data_tm).d = (int)((ulong)uVar7 >> 0x20);
      (this->weight_data_tm).c = *(int *)(&this->field_0x188 + (long)p_Var2);
      (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x190 + (long)p_Var2);
    }
  }
  else {
    local_70 = &this->weight_data_tm;
    local_f0 = *(undefined4 **)(&this->field_0x150 + (long)p_Var2);
    Mat::create(local_70,(int)(_h * _h_00 * uVar1) / (int)(uVar24 * uVar23),(uVar23 * 4) * uVar16,
                uVar24 * uVar23,(Allocator *)0x0);
    pMVar8 = local_70;
    uVar21 = 0;
    local_38 = (this->weight_data_tm).data;
    uVar20 = uVar15 & 0xffffffff;
    if (_h < 1) {
      uVar20 = uVar21;
    }
    local_48 = 0;
    if (0 < (int)local_78) {
      local_48 = local_78 & 0xffffffff;
    }
    local_50 = 0;
    if (0 < (int)local_80) {
      local_50 = local_80 & 0xffffffff;
    }
    local_68 = 0;
    if (0 < (int)uVar1) {
      local_68 = (ulong)uVar1;
    }
    lVar14 = (long)_h * local_80 * local_78;
    local_58 = lVar14 * 4;
    local_60 = local_78 * 4;
    puVar26 = local_f0;
    for (; puVar12 = puVar26, uVar21 != local_68; uVar21 = uVar21 + 1) {
      local_e8 = puVar12;
      for (uVar15 = 0; uVar15 != local_50; uVar15 = uVar15 + 1) {
        puVar26 = local_e8;
        for (uVar16 = 0; puVar25 = puVar26, uVar16 != local_48; uVar16 = uVar16 + 1) {
          puVar26 = puVar25;
          for (uVar13 = 0; uVar20 != uVar13; uVar13 = uVar13 + 1) {
            uVar4 = (ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff;
            uVar5 = (ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff;
            *(undefined4 *)
             ((long)local_38 +
             (long)(int)((((((int)((long)uVar5 / (long)(int)uVar23) * (int)local_80 + (int)uVar15) *
                            (int)local_78 + (int)uVar16) * (_h / (int)uVar24) +
                          (int)((long)uVar4 / (long)(int)uVar24)) * uVar24 +
                         (int)((long)uVar4 % (long)(int)uVar24)) * uVar23 +
                        (int)((long)uVar5 % (long)(int)uVar23)) * 4) = *puVar26;
            puVar26 = puVar26 + local_80 * local_78;
          }
          puVar26 = puVar25 + 1;
          local_40 = puVar25;
        }
        local_e8 = local_e8 + local_78;
      }
      puVar26 = puVar12 + lVar14;
      local_f0 = puVar12;
    }
    local_cc = uVar1;
    Mat::reshape((Mat *)&pd,local_70,_h / (int)uVar24,_h_00,(int)uVar1 / (int)uVar23,
                 (Allocator *)0x0);
    piVar11 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
    if ((Mat *)&pd != pMVar8) {
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      piVar11 = (this->weight_data_tm).refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          pAVar3 = (this->weight_data_tm).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            free((this->weight_data_tm).data);
          }
          else {
            (*pAVar3->_vptr_Allocator[3])();
          }
        }
      }
      piVar11 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
      (this->weight_data_tm).data = pd._vptr_ParamDict;
      (this->weight_data_tm).refcount = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
      (this->weight_data_tm).elemsize = (size_t)local_178;
      (this->weight_data_tm).elempack = local_170;
      (this->weight_data_tm).allocator = local_168;
      (this->weight_data_tm).dims = iStack_160;
      (this->weight_data_tm).w = iStack_15c;
      (this->weight_data_tm).h = (undefined4)sStack_158;
      (this->weight_data_tm).d = sStack_158._4_4_;
      (this->weight_data_tm).c = local_150[0];
      (this->weight_data_tm).cstep = local_148[0];
    }
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_168 == (Allocator *)0x0) {
          free(pd._vptr_ParamDict);
        }
        else {
          (*local_168->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (opt->lightmode == true) {
    p_Var2 = this->_vptr_DeformableConv2D_x86_avx512[-3];
    piVar11 = *(int **)(&this->field_0x158 + (long)p_Var2);
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (*(long **)(&this->field_0x170 + (long)p_Var2) == (long *)0x0) {
          free(*(void **)(&this->field_0x150 + (long)p_Var2));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x170 + (long)p_Var2) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x190 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x15c + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x164 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x150 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x178 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x180 + (long)p_Var2) = 0;
    *(undefined4 *)(&this->field_0x188 + (long)p_Var2) = 0;
  }
  return 0;
}

Assistant:

int DeformableConv2D_x86_avx512::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else if (elempack == 1 && out_elempack == 1)
    {
        weight_data_tm = weight_data;
    }
    else
    {
        deformableconv2d_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}